

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddExecutableCommand.cxx
# Opt level: O0

bool cmAddExecutableCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmAlphaNum *this;
  string *tgtName;
  string *lname;
  const_iterator this_00;
  cmExecutionStatus *pcVar1;
  bool bVar2;
  reference pbVar3;
  long lVar4;
  size_type sVar5;
  cmTarget *pcVar6;
  bool local_549;
  byte local_471;
  allocator<char> local_459;
  string local_458;
  allocator<char> local_431;
  string local_430;
  cmTarget *local_410;
  cmTarget *tgt;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_400;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3f8;
  undefined1 local_3f0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srclists;
  undefined1 local_3d0 [8];
  string msg;
  cmAlphaNum local_380;
  string local_350;
  cmAlphaNum local_330;
  cmAlphaNum local_300;
  string local_2d0;
  TargetType local_2ac;
  undefined1 local_2a8 [4];
  TargetType type;
  cmAlphaNum local_278;
  string local_248;
  cmTarget *local_228;
  cmTarget *aliasedTarget;
  cmAlphaNum local_1f0;
  string local_1c0;
  string *local_1a0;
  string *aliasedName;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  bool local_81;
  const_iterator cStack_80;
  bool nameOk;
  byte local_76;
  byte local_75;
  byte local_74;
  byte local_73;
  byte local_72;
  byte local_71;
  bool isAlias;
  bool importGlobal;
  bool importTarget;
  bool excludeFromAll;
  bool use_macbundle;
  reference pbStack_70;
  bool use_win32;
  string *exename;
  const_iterator s;
  cmMakefile *mf;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  pcVar1 = local_20;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    s._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   cmExecutionStatus::GetMakefile(local_20);
    exename = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)status_local);
    pbStack_70 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&exename);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&exename);
    local_71 = 0;
    local_72 = 0;
    local_73 = 0;
    local_74 = 0;
    local_75 = 0;
    local_76 = 0;
LAB_0055c11f:
    cStack_80 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)status_local);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&exename,&stack0xffffffffffffff80);
    if (bVar2) {
      pbVar3 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&exename);
      bVar2 = std::operator==(pbVar3,"WIN32");
      if (bVar2) {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&exename);
        local_71 = 1;
      }
      else {
        pbVar3 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&exename);
        bVar2 = std::operator==(pbVar3,"MACOSX_BUNDLE");
        if (bVar2) {
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&exename);
          local_72 = 1;
        }
        else {
          pbVar3 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&exename);
          bVar2 = std::operator==(pbVar3,"EXCLUDE_FROM_ALL");
          if (bVar2) {
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&exename);
            local_73 = 1;
          }
          else {
            pbVar3 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&exename);
            bVar2 = std::operator==(pbVar3,"IMPORTED");
            if (bVar2) {
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&exename);
              local_74 = 1;
            }
            else {
              if ((local_74 & 1) != 0) {
                pbVar3 = __gnu_cxx::
                         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&exename);
                bVar2 = std::operator==(pbVar3,"GLOBAL");
                if (bVar2) {
                  __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&exename);
                  local_75 = 1;
                  goto LAB_0055c11f;
                }
              }
              pbVar3 = __gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&exename);
              bVar2 = std::operator==(pbVar3,"ALIAS");
              if (!bVar2) goto LAB_0055c270;
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&exename);
              local_76 = 1;
            }
          }
        }
      }
      goto LAB_0055c11f;
    }
LAB_0055c270:
    if (((local_74 & 1) != 0) && ((local_75 & 1) == 0)) {
      local_75 = cmMakefile::IsImportedTargetGlobalScope((cmMakefile *)s._M_current);
    }
    bVar2 = cmGeneratorExpression::IsValidTargetName(pbStack_70);
    local_471 = 0;
    if (bVar2) {
      bVar2 = cmGlobalGenerator::IsReservedTarget(pbStack_70);
      local_471 = bVar2 ^ 0xff;
    }
    local_81 = (bool)(local_471 & 1);
    if (((local_81 != false) && ((local_74 & 1) == 0)) && ((local_76 & 1) == 0)) {
      lVar4 = std::__cxx11::string::find((char)pbStack_70,0x3a);
      local_81 = lVar4 == -1;
    }
    if ((local_81 != false) ||
       (bVar2 = cmMakefile::CheckCMP0037((cmMakefile *)s._M_current,pbStack_70,EXECUTABLE), bVar2))
    {
      pcVar1 = local_20;
      if (((local_74 & 1) == 0) ||
         ((((local_71 & 1) == 0 && ((local_72 & 1) == 0)) && ((local_73 & 1) == 0)))) {
        if ((local_76 & 1) == 0) {
          if ((local_74 & 1) == 0) {
            std::__cxx11::string::string((string *)local_3d0);
            bVar2 = cmMakefile::EnforceUniqueName
                              ((cmMakefile *)s._M_current,pbStack_70,(string *)local_3d0,false);
            if (!bVar2) {
              cmExecutionStatus::SetError(local_20,(string *)local_3d0);
              args_local._7_1_ = 0;
            }
            srclists.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
            srclists.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar2;
            std::__cxx11::string::~string((string *)local_3d0);
            if (srclists.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
              local_3f8._M_current = exename;
              local_400._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local);
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)((long)&tgt + 7));
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         local_3f0,local_3f8,local_400,
                         (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)((long)&tgt + 7));
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)((long)&tgt + 7));
              pcVar6 = cmMakefile::AddExecutable
                                 ((cmMakefile *)s._M_current,pbStack_70,
                                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_3f0,(bool)(local_73 & 1));
              local_410 = pcVar6;
              if ((local_71 & 1) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_430,"WIN32_EXECUTABLE",&local_431);
                cmTarget::SetProperty(pcVar6,&local_430,"ON");
                std::__cxx11::string::~string((string *)&local_430);
                std::allocator<char>::~allocator(&local_431);
              }
              pcVar6 = local_410;
              if ((local_72 & 1) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_458,"MACOSX_BUNDLE",&local_459);
                cmTarget::SetProperty(pcVar6,&local_458,"ON");
                std::__cxx11::string::~string((string *)&local_458);
                std::allocator<char>::~allocator(&local_459);
              }
              args_local._7_1_ = 1;
              srclists.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_3f0);
            }
          }
          else {
            pcVar6 = cmMakefile::FindTargetToUse((cmMakefile *)s._M_current,pbStack_70,false);
            pcVar1 = local_20;
            if (pcVar6 == (cmTarget *)0x0) {
              cmMakefile::AddImportedTarget
                        ((cmMakefile *)s._M_current,pbStack_70,EXECUTABLE,(bool)(local_75 & 1));
              args_local._7_1_ = 1;
            }
            else {
              cmAlphaNum::cmAlphaNum(&local_380,"cannot create imported target \"");
              this = (cmAlphaNum *)((long)&msg.field_2 + 8);
              cmAlphaNum::cmAlphaNum(this,pbStack_70);
              cmStrCat<char[60]>(&local_350,&local_380,this,
                                 (char (*) [60])
                                 "\" because another target with the same name already exists.");
              cmExecutionStatus::SetError(pcVar1,&local_350);
              std::__cxx11::string::~string((string *)&local_350);
              args_local._7_1_ = 0;
            }
          }
        }
        else {
          bVar2 = cmGeneratorExpression::IsValidTargetName(pbStack_70);
          pcVar1 = local_20;
          if (bVar2) {
            if ((local_73 & 1) == 0) {
              if (((local_74 & 1) == 0) && ((local_75 & 1) == 0)) {
                sVar5 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)status_local);
                pcVar1 = local_20;
                if (sVar5 == 3) {
                  local_1a0 = __gnu_cxx::
                              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&exename);
                  bVar2 = cmMakefile::IsAlias((cmMakefile *)s._M_current,local_1a0);
                  pcVar1 = local_20;
                  if (bVar2) {
                    cmAlphaNum::cmAlphaNum(&local_1f0,"cannot create ALIAS target \"");
                    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&aliasedTarget,pbStack_70);
                    cmStrCat<char[19],std::__cxx11::string,char[22]>
                              (&local_1c0,&local_1f0,(cmAlphaNum *)&aliasedTarget,
                               (char (*) [19])"\" because target \"",local_1a0,
                               (char (*) [22])"\" is itself an ALIAS.");
                    cmExecutionStatus::SetError(pcVar1,&local_1c0);
                    std::__cxx11::string::~string((string *)&local_1c0);
                    args_local._7_1_ = 0;
                  }
                  else {
                    local_228 = cmMakefile::FindTargetToUse
                                          ((cmMakefile *)s._M_current,local_1a0,true);
                    pcVar1 = local_20;
                    if (local_228 == (cmTarget *)0x0) {
                      cmAlphaNum::cmAlphaNum(&local_278,"cannot create ALIAS target \"");
                      cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_2a8,pbStack_70);
                      cmStrCat<char[19],std::__cxx11::string,char[26]>
                                (&local_248,&local_278,(cmAlphaNum *)local_2a8,
                                 (char (*) [19])"\" because target \"",local_1a0,
                                 (char (*) [26])"\" does not already exist.");
                      cmExecutionStatus::SetError(pcVar1,&local_248);
                      std::__cxx11::string::~string((string *)&local_248);
                      args_local._7_1_ = 0;
                    }
                    else {
                      local_2ac = cmTarget::GetType(local_228);
                      pcVar1 = local_20;
                      this_00 = s;
                      lname = pbStack_70;
                      tgtName = local_1a0;
                      if (local_2ac == EXECUTABLE) {
                        bVar2 = cmTarget::IsImported(local_228);
                        local_549 = true;
                        if (bVar2) {
                          local_549 = cmTarget::IsImportedGloballyVisible(local_228);
                        }
                        cmMakefile::AddAlias
                                  ((cmMakefile *)this_00._M_current,lname,tgtName,local_549);
                        args_local._7_1_ = 1;
                      }
                      else {
                        cmAlphaNum::cmAlphaNum(&local_300,"cannot create ALIAS target \"");
                        cmAlphaNum::cmAlphaNum(&local_330,pbStack_70);
                        cmStrCat<char[19],std::__cxx11::string,char[24]>
                                  (&local_2d0,&local_300,&local_330,
                                   (char (*) [19])"\" because target \"",local_1a0,
                                   (char (*) [24])"\" is not an executable.");
                        cmExecutionStatus::SetError(pcVar1,&local_2d0);
                        std::__cxx11::string::~string((string *)&local_2d0);
                        args_local._7_1_ = 0;
                      }
                    }
                  }
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_190,"ALIAS requires exactly one target argument.",
                             (allocator<char> *)((long)&aliasedName + 7));
                  cmExecutionStatus::SetError(pcVar1,&local_190);
                  std::__cxx11::string::~string((string *)&local_190);
                  std::allocator<char>::~allocator((allocator<char> *)((long)&aliasedName + 7));
                  args_local._7_1_ = 0;
                }
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_168,"IMPORTED with ALIAS is not allowed.",&local_169);
                cmExecutionStatus::SetError(pcVar1,&local_168);
                std::__cxx11::string::~string((string *)&local_168);
                std::allocator<char>::~allocator(&local_169);
                args_local._7_1_ = 0;
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_140,"EXCLUDE_FROM_ALL with ALIAS makes no sense.",
                         &local_141);
              cmExecutionStatus::SetError(pcVar1,&local_140);
              std::__cxx11::string::~string((string *)&local_140);
              std::allocator<char>::~allocator(&local_141);
              args_local._7_1_ = 0;
            }
          }
          else {
            std::operator+(&local_120,"Invalid name for ALIAS: ",pbStack_70);
            cmExecutionStatus::SetError(pcVar1,&local_120);
            std::__cxx11::string::~string((string *)&local_120);
            args_local._7_1_ = 0;
          }
        }
      }
      else {
        if ((local_71 & 1) == 0) {
          if ((local_72 & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f8,
                       "may not be given EXCLUDE_FROM_ALL for an IMPORTED target.",&local_f9);
            cmExecutionStatus::SetError(pcVar1,&local_f8);
            std::__cxx11::string::~string((string *)&local_f8);
            std::allocator<char>::~allocator(&local_f9);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_d0,"may not be given MACOSX_BUNDLE for an IMPORTED target.",
                       &local_d1);
            cmExecutionStatus::SetError(pcVar1,&local_d0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::allocator<char>::~allocator(&local_d1);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a8,"may not be given WIN32 for an IMPORTED target.",&local_a9)
          ;
          cmExecutionStatus::SetError(pcVar1,&local_a8);
          std::__cxx11::string::~string((string *)&local_a8);
          std::allocator<char>::~allocator(&local_a9);
        }
        args_local._7_1_ = 0;
      }
    }
    else {
      args_local._7_1_ = 0;
    }
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmAddExecutableCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  auto s = args.begin();

  std::string const& exename = *s;

  ++s;
  bool use_win32 = false;
  bool use_macbundle = false;
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;
  bool isAlias = false;
  while (s != args.end()) {
    if (*s == "WIN32") {
      ++s;
      use_win32 = true;
    } else if (*s == "MACOSX_BUNDLE") {
      ++s;
      use_macbundle = true;
    } else if (*s == "EXCLUDE_FROM_ALL") {
      ++s;
      excludeFromAll = true;
    } else if (*s == "IMPORTED") {
      ++s;
      importTarget = true;
    } else if (importTarget && *s == "GLOBAL") {
      ++s;
      importGlobal = true;
    } else if (*s == "ALIAS") {
      ++s;
      isAlias = true;
    } else {
      break;
    }
  }

  if (importTarget && !importGlobal) {
    importGlobal = mf.IsImportedTargetGlobalScope();
  }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(exename) &&
    !cmGlobalGenerator::IsReservedTarget(exename);

  if (nameOk && !importTarget && !isAlias) {
    nameOk = exename.find(':') == std::string::npos;
  }
  if (!nameOk && !mf.CheckCMP0037(exename, cmStateEnums::EXECUTABLE)) {
    return false;
  }

  // Special modifiers are not allowed with IMPORTED signature.
  if (importTarget && (use_win32 || use_macbundle || excludeFromAll)) {
    if (use_win32) {
      status.SetError("may not be given WIN32 for an IMPORTED target.");
    } else if (use_macbundle) {
      status.SetError(
        "may not be given MACOSX_BUNDLE for an IMPORTED target.");
    } else // if(excludeFromAll)
    {
      status.SetError(
        "may not be given EXCLUDE_FROM_ALL for an IMPORTED target.");
    }
    return false;
  }
  if (isAlias) {
    if (!cmGeneratorExpression::IsValidTargetName(exename)) {
      status.SetError("Invalid name for ALIAS: " + exename);
      return false;
    }
    if (excludeFromAll) {
      status.SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
    }
    if (importTarget || importGlobal) {
      status.SetError("IMPORTED with ALIAS is not allowed.");
      return false;
    }
    if (args.size() != 3) {
      status.SetError("ALIAS requires exactly one target argument.");
      return false;
    }

    std::string const& aliasedName = *s;
    if (mf.IsAlias(aliasedName)) {
      status.SetError(cmStrCat("cannot create ALIAS target \"", exename,
                               "\" because target \"", aliasedName,
                               "\" is itself an ALIAS."));
      return false;
    }
    cmTarget* aliasedTarget = mf.FindTargetToUse(aliasedName, true);
    if (!aliasedTarget) {
      status.SetError(cmStrCat("cannot create ALIAS target \"", exename,
                               "\" because target \"", aliasedName,
                               "\" does not already exist."));
      return false;
    }
    cmStateEnums::TargetType type = aliasedTarget->GetType();
    if (type != cmStateEnums::EXECUTABLE) {
      status.SetError(cmStrCat("cannot create ALIAS target \"", exename,
                               "\" because target \"", aliasedName,
                               "\" is not an executable."));
      return false;
    }
    mf.AddAlias(exename, aliasedName,
                !aliasedTarget->IsImported() ||
                  aliasedTarget->IsImportedGloballyVisible());
    return true;
  }

  // Handle imported target creation.
  if (importTarget) {
    // Make sure the target does not already exist.
    if (mf.FindTargetToUse(exename)) {
      status.SetError(cmStrCat(
        "cannot create imported target \"", exename,
        "\" because another target with the same name already exists."));
      return false;
    }

    // Create the imported target.
    mf.AddImportedTarget(exename, cmStateEnums::EXECUTABLE, importGlobal);
    return true;
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!mf.EnforceUniqueName(exename, msg)) {
      status.SetError(msg);
      return false;
    }
  }

  std::vector<std::string> srclists(s, args.end());
  cmTarget* tgt = mf.AddExecutable(exename, srclists, excludeFromAll);
  if (use_win32) {
    tgt->SetProperty("WIN32_EXECUTABLE", "ON");
  }
  if (use_macbundle) {
    tgt->SetProperty("MACOSX_BUNDLE", "ON");
  }

  return true;
}